

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

ly_set * lys_find_xpath(ly_ctx *ctx,lys_node *node,char *expr,int options)

{
  int iVar1;
  LY_ERR *pLVar2;
  int local_78;
  uint local_74;
  int opts;
  uint32_t i;
  ly_set *ret_set;
  lyxp_set set;
  int options_local;
  char *expr_local;
  lys_node *node_local;
  ly_ctx *ctx_local;
  
  if (((ctx == (ly_ctx *)0x0) && (node == (lys_node *)0x0)) || (expr == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    expr_local = (char *)node;
    if ((node == (lys_node *)0x0) &&
       (expr_local = (char *)ly_ctx_get_node(ctx,(lys_node *)0x0,"/ietf-yang-library:modules-state")
       , (lys_node *)expr_local == (lys_node *)0x0)) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      memset(&ret_set,0,0x30);
      local_78 = 4;
      if ((options & 1U) != 0) {
        local_78 = 0x24;
      }
      iVar1 = lyxp_atomize(expr,(lys_node *)expr_local,LYXP_NODE_ELEM,(lyxp_set *)&ret_set,local_78)
      ;
      if (iVar1 == 0) {
        ctx_local = (ly_ctx *)ly_set_new();
        for (local_74 = 0; local_74 < (uint)set.val._8_4_; local_74 = local_74 + 1) {
          if (*(int *)(set._8_8_ + (ulong)local_74 * 0x10 + 0xc) != 0) {
            if (*(int *)(set._8_8_ + (ulong)local_74 * 0x10 + 0xc) != 1) {
              __assert_fail("set.val.snodes[i].in_ctx == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                            ,0xf1b,
                            "struct ly_set *lys_find_xpath(struct ly_ctx *, const struct lys_node *, const char *, int)"
                           );
            }
            if ((*(int *)(set._8_8_ + 8 + (ulong)local_74 * 0x10) == 2) &&
               (iVar1 = ly_set_add((ly_set *)ctx_local,
                                   *(void **)(set._8_8_ + (ulong)local_74 * 0x10),1), iVar1 == -1))
            {
              ly_set_free((ly_set *)ctx_local);
              free((void *)set._8_8_);
              return (ly_set *)0x0;
            }
          }
        }
        free((void *)set._8_8_);
      }
      else {
        for (local_74 = 0; local_74 < (uint)set.val._8_4_; local_74 = local_74 + 1) {
          if (*(int *)(set._8_8_ + (ulong)local_74 * 0x10 + 0xc) == 1) {
            expr_local = *(char **)(set._8_8_ + (ulong)local_74 * 0x10);
            break;
          }
        }
        free((void *)set._8_8_);
        ly_vlog(LYE_SPEC,LY_VLOG_LYS,expr_local,"Resolving XPath expression \"%s\" failed.",expr);
        ctx_local = (ly_ctx *)0x0;
      }
    }
  }
  return (ly_set *)ctx_local;
}

Assistant:

ly_set *
lys_find_xpath(struct ly_ctx *ctx, const struct lys_node *node, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;
    int opts;

    if ((!ctx && !node) || !expr) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (!node) {
        node = ly_ctx_get_node(ctx, NULL, "/ietf-yang-library:modules-state");
        if (!node) {
            ly_errno = LY_EINT;
            return NULL;
        }
    }

    memset(&set, 0, sizeof set);

    opts = LYXP_SNODE;
    if (options & LYS_FIND_OUTPUT) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    if (lyxp_atomize(expr, node, LYXP_NODE_ELEM, &set, opts)) {
        /* just find a relevant node to put in path, if it fails, use the original one */
        for (i = 0; i < set.used; ++i) {
            if (set.val.snodes[i].in_ctx == 1) {
                node = set.val.snodes[i].snode;
                break;
            }
        }
        free(set.val.snodes);
        LOGVAL(LYE_SPEC, LY_VLOG_LYS, node, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        if (!set.val.snodes[i].in_ctx) {
            continue;
        }
        assert(set.val.snodes[i].in_ctx == 1);

        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}